

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O1

FIOBJ fiobj_hash_pop(FIOBJ hash,FIOBJ *key)

{
  int *piVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (((uint)hash & 7) != 4) {
    __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                  ,0xdb,"FIOBJ fiobj_hash_pop(FIOBJ, FIOBJ *)");
  }
  uVar6 = hash & 0xfffffffffffffff8;
  if (*(long *)(uVar6 + 8) == 0) {
    if ((*(long *)(uVar6 + 0x20) == 0) || (*(long *)(uVar6 + 0x18) == 0)) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ulong *)(*(long *)(uVar6 + 0x20) + -8 + *(long *)(uVar6 + 0x18) * 0x18);
    }
    if ((((~(uint)uVar7 & 6) != 0) && (uVar7 != 0)) && ((uVar7 & 1) == 0)) {
      LOCK();
      piVar1 = (int *)((uVar7 & 0xfffffffffffffff8) + 4);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    if (key != (FIOBJ *)0x0) {
      if ((*(long *)(uVar6 + 0x20) == 0) || (*(long *)(uVar6 + 0x18) == 0)) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ulong *)(*(long *)(uVar6 + 0x20) + -0x10 + *(long *)(uVar6 + 0x18) * 0x18);
      }
      if ((((~(uint)uVar3 & 6) != 0) && (uVar3 != 0)) && ((uVar3 & 1) == 0)) {
        LOCK();
        piVar1 = (int *)((uVar3 & 0xfffffffffffffff8) + 4);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      *key = uVar3;
    }
    if ((*(long *)(uVar6 + 0x20) != 0) && (*(long *)(uVar6 + 0x18) != 0)) {
      fiobj_free(*(FIOBJ *)(*(long *)(uVar6 + 0x20) + -0x10 + *(long *)(uVar6 + 0x18) * 0x18));
      lVar2 = *(long *)(uVar6 + 0x18);
      lVar4 = *(long *)(uVar6 + 0x20);
      *(undefined8 *)(lVar4 + -0x10 + lVar2 * 0x18) = 0;
      fiobj_free(*(FIOBJ *)(lVar4 + -8 + lVar2 * 0x18));
      lVar4 = *(long *)(uVar6 + 0x18);
      lVar2 = *(long *)(uVar6 + 0x20) + lVar4 * 0x18;
      plVar5 = (long *)(lVar2 + -0x30);
      *(undefined8 *)(lVar2 + -8) = 0;
      *(undefined8 *)(lVar2 + -0x18) = 0;
      *(long *)(uVar6 + 8) = *(long *)(uVar6 + 8) + -1;
      do {
        if (lVar4 == 1) {
          lVar4 = 0;
          break;
        }
        lVar4 = lVar4 + -1;
        lVar2 = *plVar5;
        plVar5 = plVar5 + -3;
      } while (lVar2 == 0);
      *(long *)(uVar6 + 0x18) = lVar4;
    }
  }
  else {
    uVar7 = 0;
  }
  return uVar7;
}

Assistant:

FIOBJ fiobj_hash_pop(FIOBJ hash, FIOBJ *key) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  FIOBJ old;
  if (fio_hash___count(&obj2hash(hash)->hash))
    return FIOBJ_INVALID;
  old = fiobj_dup(fio_hash___last(&obj2hash(hash)->hash).obj);
  if (key)
    *key = fiobj_dup(fio_hash___last(&obj2hash(hash)->hash).key);
  fio_hash___pop(&obj2hash(hash)->hash);
  return old;
}